

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# model.cc
# Opt level: O0

uint gvr::anon_unknown_1::findOrStoreVertex
               (Mesh *mesh,
               set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
               *vni,int *vn,Vector3f *v,Vector3f *normal)

{
  bool bVar1;
  iterator __x;
  iterator this;
  pointer pVVar2;
  int *in_RDX;
  pair<std::_Rb_tree_const_iterator<gvr::(anonymous_namespace)::VertexNormalIndex>,_bool> pVar3;
  iterator it;
  VertexNormalIndex p;
  undefined4 in_stack_ffffffffffffff88;
  uint32_t in_stack_ffffffffffffff8c;
  key_type *in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  _Self in_stack_ffffffffffffffa0;
  set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
  *in_stack_ffffffffffffffb0;
  uint local_34;
  uint local_4;
  
  VertexNormalIndex::VertexNormalIndex
            ((VertexNormalIndex *)in_stack_ffffffffffffffa0._M_node,
             (Vector3f *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
             (Vector3f *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff8c);
  __x = std::
        set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
        ::find((set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
               in_stack_ffffffffffffff90);
  this = std::
         set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
         ::end((set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
                *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88));
  bVar1 = std::operator!=((_Self *)&stack0xffffffffffffffa8,(_Self *)&stack0xffffffffffffffa0);
  if (bVar1) {
    pVVar2 = std::_Rb_tree_const_iterator<gvr::(anonymous_namespace)::VertexNormalIndex>::operator->
                       ((_Rb_tree_const_iterator<gvr::(anonymous_namespace)::VertexNormalIndex> *)
                        0x132cea);
    local_4 = pVVar2->index;
  }
  else {
    pVar3 = std::
            set<gvr::(anonymous_namespace)::VertexNormalIndex,_std::less<gvr::(anonymous_namespace)::VertexNormalIndex>,_std::allocator<gvr::(anonymous_namespace)::VertexNormalIndex>_>
            ::insert(in_stack_ffffffffffffffb0,(value_type *)__x._M_node);
    PointCloud::setVertex
              ((PointCloud *)this._M_node,in_stack_ffffffffffffff9c,
               (Vector3f *)pVar3.first._M_node._M_node);
    *in_RDX = *in_RDX + 1;
    local_4 = local_34;
  }
  return local_4;
}

Assistant:

unsigned int findOrStoreVertex(Mesh *mesh, std::set<VertexNormalIndex> &vni,
  int &vn, const gmath::Vector3f &v, const gmath::Vector3f &normal)
{
  // try to find point v in the vertex list of mesh, but it is only considered
  // a duplicate if the normals are the same


  VertexNormalIndex p(v, normal, vn);
  std::set<VertexNormalIndex>::iterator it=vni.find(p);

  // add the vertex, if a duplicate cannot be found

  if (it != vni.end())
  {
    return it->index;
  }
  else
  {
    vni.insert(p);
    mesh->setVertex(vn, v);
    vn++;

    return p.index;
  }
}